

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_hqresize.cpp
# Opt level: O1

void scale3x(uint32 *input,uint32 *output,size_t width,size_t height)

{
  ulong uVar1;
  size_t sVar2;
  uint32 uVar3;
  uint32 uVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint32 uVar7;
  uint32 uVar8;
  uint32 uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint32 uVar14;
  uint32 uVar15;
  ulong uVar16;
  uint32 *puVar17;
  uint32 *puVar18;
  uint32 uVar19;
  long lVar20;
  uint32 uVar21;
  uint32 uVar22;
  uint32 uVar23;
  bool bVar24;
  long local_c0;
  uint32 *local_b0;
  
  if (width != 0) {
    local_c0 = 0;
    uVar11 = 0;
    local_b0 = output;
    do {
      uVar1 = uVar11 + 1;
      if (height != 0) {
        uVar16 = uVar11;
        if (uVar11 < width - 1) {
          uVar16 = uVar1;
        }
        iVar10 = (int)uVar11 + -1;
        if (uVar11 == 0) {
          iVar10 = 0;
        }
        lVar12 = (long)(int)uVar16;
        puVar17 = local_b0;
        puVar18 = input;
        uVar16 = 0;
        do {
          lVar13 = 0;
          if (uVar16 != 0) {
            lVar13 = uVar16 - 1;
          }
          sVar2 = uVar16 + 1;
          if (uVar16 < height - 1) {
            uVar16 = sVar2;
          }
          uVar3 = *(uint32 *)
                   ((long)puVar18 +
                   ((long)((local_c0 + (ulong)(uVar11 != 0) * -4) * 0x40000000) >> 0x1e));
          uVar4 = *(uint32 *)((long)puVar18 + local_c0);
          uVar21 = puVar18[lVar12];
          if (uVar3 == uVar21) {
LAB_00435f22:
            *puVar17 = uVar4;
            puVar17[width * 3] = uVar4;
            puVar17[width * 6] = uVar4;
            puVar17[1] = uVar4;
            puVar17[width * 3 + 1] = uVar4;
            puVar17[width * 6 + 1] = uVar4;
            puVar17[2] = uVar4;
            puVar17[width * 3 + 2] = uVar4;
            puVar17[width * 6 + 2] = uVar4;
          }
          else {
            lVar13 = lVar13 * width;
            lVar20 = uVar16 * width;
            uVar23 = input[uVar11 + lVar13];
            uVar5 = input[uVar11 + lVar20];
            if (uVar23 == uVar5) goto LAB_00435f22;
            uVar14 = uVar23;
            if (uVar4 == input[iVar10 + lVar13]) {
              uVar14 = uVar4;
            }
            if (uVar23 != uVar21) {
              uVar14 = uVar4;
            }
            uVar6 = uVar5;
            if (uVar4 == input[iVar10 + lVar20]) {
              uVar6 = uVar4;
            }
            uVar19 = uVar21;
            uVar22 = uVar23;
            if (uVar4 == input[lVar12 + lVar13]) {
              uVar19 = uVar4;
              uVar22 = uVar14;
            }
            uVar7 = uVar4;
            uVar8 = uVar4;
            uVar15 = uVar4;
            if (uVar21 == uVar5) {
              uVar7 = uVar5;
              uVar8 = uVar6;
              uVar15 = uVar19;
            }
            uVar19 = uVar21;
            uVar6 = uVar5;
            if (uVar4 == input[lVar12 + lVar20]) {
              uVar19 = uVar15;
              uVar6 = uVar8;
            }
            uVar9 = uVar23;
            if (uVar23 != uVar21) {
              uVar19 = uVar15;
              uVar9 = uVar4;
            }
            uVar21 = uVar4;
            if (uVar4 != input[iVar10 + lVar13]) {
              uVar21 = uVar3;
            }
            if (uVar3 != uVar5) {
              uVar21 = uVar4;
            }
            uVar15 = uVar3;
            if (uVar4 == input[iVar10 + lVar20]) {
              uVar15 = uVar21;
            }
            if (uVar3 != uVar5) {
              uVar5 = uVar4;
              uVar6 = uVar8;
            }
            bVar24 = uVar23 != uVar3;
            if (bVar24) {
              uVar23 = uVar4;
            }
            *puVar17 = uVar23;
            if (bVar24) {
              uVar15 = uVar21;
            }
            puVar17[width * 3] = uVar15;
            puVar17[width * 6] = uVar5;
            if (bVar24) {
              uVar22 = uVar14;
            }
            puVar17[1] = uVar22;
            puVar17[width * 3 + 1] = uVar4;
            puVar17[width * 6 + 1] = uVar6;
            puVar17[2] = uVar9;
            puVar17[width * 3 + 2] = uVar19;
            puVar17[width * 6 + 2] = uVar7;
          }
          puVar17 = puVar17 + width * 9;
          puVar18 = puVar18 + width;
          uVar16 = sVar2;
        } while (sVar2 != height);
      }
      local_b0 = local_b0 + 3;
      local_c0 = local_c0 + 4;
      uVar11 = uVar1;
    } while (uVar1 != width);
  }
  return;
}

Assistant:

static void scale3x(uint32* const input, uint32* const output, const size_t width, const size_t height)
{
	const size_t scaledWidth = 3 * width;

	for (size_t i = 0; i < width; ++i)
	{
		const int iMinus = (i > 0        ) ? (i - 1) : 0;
		const int iPlus  = (i < width - 1) ? (i + 1) : i;

		for (size_t j = 0; j < height; ++j)
		{
			const size_t jMinus = (j > 0          ) ? (j - 1) : 0;
			const size_t jPlus  = (j < height - 1 ) ? (j + 1) : j;

			const uint32 A = input[iMinus + width * jMinus];
			const uint32 B = input[iMinus + width * j     ];
			const uint32 C = input[iMinus + width * jPlus ];
			const uint32 D = input[i      + width * jMinus];
			const uint32 E = input[i      + width * j     ];
			const uint32 F = input[i      + width * jPlus ];
			const uint32 G = input[iPlus  + width * jMinus];
			const uint32 H = input[iPlus  + width * j     ];
			const uint32 I = input[iPlus  + width * jPlus ];

			if (B != H && D != F)
			{
				output[3 * i     + scaledWidth *  3 * j     ] = D == B ? D : E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = (D == B && E != C) || (B == F && E != A) ? B : E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = B == F ? F : E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = (D == B && E != G) || (D == H && E != A) ? D : E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = (B == F && E != I) || (H == F && E != C) ? F : E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = D == H ? D : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = (D == H && E != I) || (H == F && E != G) ? H : E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = H == F ? F : E;
			}                                       
			else
			{
				output[3 * i     + scaledWidth *  3 * j     ] = E;
				output[3 * i     + scaledWidth * (3 * j + 1)] = E;
				output[3 * i     + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 1 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 1 + scaledWidth * (3 * j + 2)] = E;
				output[3 * i + 2 + scaledWidth *  3 * j     ] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 1)] = E;
				output[3 * i + 2 + scaledWidth * (3 * j + 2)] = E;
			}
		}
	}
}